

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entenc.c
# Opt level: O2

void od_ec_enc_init(od_ec_enc *enc,uint32_t size)

{
  uchar *puVar1;
  
  enc->offs = 0;
  enc->low = 0;
  enc->rng = 0x8000;
  enc->cnt = -9;
  enc->error = 0;
  puVar1 = (uchar *)malloc((ulong)size);
  enc->buf = puVar1;
  enc->storage = size;
  if (puVar1 == (uchar *)0x0 && size != 0) {
    enc->storage = 0;
    enc->error = -1;
  }
  return;
}

Assistant:

void od_ec_enc_init(od_ec_enc *enc, uint32_t size) {
  od_ec_enc_reset(enc);
  enc->buf = (unsigned char *)malloc(sizeof(*enc->buf) * size);
  enc->storage = size;
  if (size > 0 && enc->buf == NULL) {
    enc->storage = 0;
    enc->error = -1;
  }
}